

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi.cpp
# Opt level: O0

QDebug operator<<(QDebug *dbg,QRhiShaderResourceBindings *srb)

{
  QDebug *pQVar1;
  QDebug *in_RSI;
  QVarLengthArray<QRhiShaderResourceBinding,_12LL> *in_RDI;
  long in_FS_OFFSET;
  QDebugStateSaver saver;
  QVarLengthArray<QRhiShaderResourceBinding,_12LL> *vec;
  QDebug local_20;
  QDebug in_stack_ffffffffffffffe8;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  vec = in_RDI;
  QDebugStateSaver::QDebugStateSaver((QDebugStateSaver *)&local_10,in_RSI);
  QDebug::nospace(in_RSI);
  pQVar1 = QDebug::operator<<(in_RSI,(char *)in_stack_ffffffffffffffe8.stream);
  QDebug::QDebug(&local_20,pQVar1);
  pQVar1 = (QDebug *)&stack0xffffffffffffffe8;
  operator<<(in_RSI,vec);
  QDebug::operator<<(pQVar1,(char)((ulong)in_RDI >> 0x38));
  QDebug::~QDebug(pQVar1);
  QDebug::~QDebug(&local_20);
  QDebug::QDebug(pQVar1,(QDebug *)in_RDI);
  QDebugStateSaver::~QDebugStateSaver((QDebugStateSaver *)&local_10);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (QDebug)(Stream *)in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug dbg, const QRhiShaderResourceBindings &srb)
{
    QDebugStateSaver saver(dbg);
    dbg.nospace() << "QRhiShaderResourceBindings("
                  << srb.m_bindings
                  << ')';
    return dbg;
}